

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<int,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<int,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  format_specs *pfVar2;
  bool bVar3;
  int num_digits;
  bin_writer<3> f;
  uint uVar4;
  string_view prefix;
  
  uVar1 = this->abs_value;
  f.num_digits = 0;
  f.abs_value = uVar1;
  num_digits = 0;
  uVar4 = uVar1;
  do {
    f = (bin_writer<3>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    bVar3 = 7 < uVar4;
    uVar4 = uVar4 >> 3;
  } while (bVar3);
  pfVar2 = this->specs;
  if (((char)pfVar2->field_0x9 < '\0') && (uVar1 != 0 && pfVar2->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,
             *pfVar2,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }